

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_short,short>::
Flush<duckdb::BitpackingCompressionState<unsigned_short,true,short>::BitpackingWriter>
          (BitpackingState<unsigned_short,short> *this)

{
  BitpackingState<unsigned_short,short> *pBVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  idx_t iVar4;
  unsigned_short *values;
  short sVar5;
  BitpackingState<unsigned_short,short> BVar6;
  unsigned_short uVar7;
  long lVar8;
  unsigned_long uVar9;
  byte bVar10;
  uint16_t left;
  byte bVar11;
  uint16_t right;
  idx_t iVar12;
  bool bVar13;
  ulong uVar14;
  
  bVar13 = true;
  if (*(idx_t *)(this + 0x2810) == 0) {
    return true;
  }
  if (this[0x2837] == (BitpackingState<unsigned_short,short>)0x0) {
    right = *(uint16_t *)(this + 0x2828);
    left = *(uint16_t *)(this + 0x282a);
    if (left != right) goto LAB_01722089;
  }
  left = *(uint16_t *)(this + 0x282a);
  if ((byte)((char)this[0x283a] - 1U) < 2) {
    BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteConstant
              (left,*(idx_t *)(this + 0x2810),*(void **)(this + 0x2820),(bool)this[0x2837]);
    *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 6;
    return true;
  }
  right = *(uint16_t *)(this + 0x2828);
LAB_01722089:
  pBVar1 = this + 0x282c;
  BVar6 = (BitpackingState<unsigned_short,short>)
          TrySubtractOperator::Operation<unsigned_short,unsigned_short,unsigned_short>
                    (left,right,(uint16_t *)pBVar1);
  this[0x2839] = BVar6;
  BitpackingState<unsigned_short,_short>::CalculateDeltaStats
            ((BitpackingState<unsigned_short,_short> *)this);
  if (this[0x2838] == (BitpackingState<unsigned_short,short>)0x1) {
    uVar7 = *(unsigned_short *)(this + 0x282e);
    if ((*(unsigned_short *)(this + 0x2830) == uVar7) && (((byte)this[0x283a] & 0xfe) != 4)) {
      BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteConstantDelta
                (*(unsigned_short *)(this + 0x2830),**(unsigned_short **)(this + 0x1008),
                 *(idx_t *)(this + 0x2810),*(unsigned_short **)(this + 0x1008),
                 (bool *)(this + 0x2010),*(void **)(this + 0x2820));
      *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 8;
      return true;
    }
    uVar3 = *(ushort *)(this + 0x2832);
    if (uVar3 == 0) {
      bVar10 = 0;
    }
    else {
      sVar5 = 0xf;
      if (uVar3 != 0) {
        for (; uVar3 >> sVar5 == 0; sVar5 = sVar5 + -1) {
        }
      }
      bVar10 = 0x10;
      if (uVar3 < 0x4000) {
        bVar10 = 0x10 - ((byte)sVar5 ^ 0xf);
      }
    }
    uVar3 = *(ushort *)pBVar1;
    if (uVar3 == 0) {
      bVar11 = 0;
    }
    else {
      sVar5 = 0xf;
      if (uVar3 != 0) {
        for (; uVar3 >> sVar5 == 0; sVar5 = sVar5 + -1) {
        }
      }
      bVar11 = 0x10;
      if (uVar3 < 0x4000) {
        bVar11 = 0x10 - ((byte)sVar5 ^ 0xf);
      }
    }
    if ((bVar10 < bVar11) && (this[0x283a] != (BitpackingState<unsigned_short,short>)0x5)) {
      pBVar1 = this + 0x1010;
      iVar4 = *(idx_t *)(this + 0x2810);
      if (iVar4 != 0) {
        iVar12 = 0;
        do {
          *(unsigned_short *)(pBVar1 + iVar12 * 2) = *(short *)(pBVar1 + iVar12 * 2) - uVar7;
          iVar12 = iVar12 + 1;
        } while (iVar4 != iVar12);
        uVar7 = *(unsigned_short *)(this + 0x282e);
      }
      BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteDeltaFor
                ((unsigned_short *)pBVar1,(bool *)(this + 0x2010),bVar10,uVar7,
                 *(short *)(this + 0x2834),*(unsigned_short **)(this + 0x1008),iVar4,
                 *(void **)(this + 0x2820));
      uVar14 = *(ulong *)(this + 0x2810);
      lVar8 = *(long *)(this + 0x2818) + 0xc;
      *(long *)(this + 0x2818) = lVar8;
      if ((uVar14 & 0x1f) != 0) {
        uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
        uVar14 = (uVar14 - uVar9) + 0x20;
        lVar8 = *(long *)(this + 0x2818);
      }
      *(ulong *)(this + 0x2818) = (bVar10 * uVar14 >> 3) + lVar8;
      return true;
    }
  }
  if (this[0x2839] == (BitpackingState<unsigned_short,short>)0x1) {
    uVar3 = *(ushort *)pBVar1;
    if (uVar3 == 0) {
      bVar10 = 0;
    }
    else {
      sVar5 = 0xf;
      if (uVar3 != 0) {
        for (; uVar3 >> sVar5 == 0; sVar5 = sVar5 + -1) {
        }
      }
      bVar10 = 0x10;
      if (uVar3 < 0x4000) {
        bVar10 = 0x10 - ((byte)sVar5 ^ 0xf);
      }
    }
    values = *(unsigned_short **)(this + 0x1008);
    uVar7 = *(unsigned_short *)(this + 0x2828);
    iVar4 = *(idx_t *)(this + 0x2810);
    if (iVar4 != 0) {
      iVar12 = 0;
      do {
        puVar2 = values + iVar12;
        *puVar2 = *puVar2 - uVar7;
        iVar12 = iVar12 + 1;
      } while (iVar4 != iVar12);
      uVar7 = *(unsigned_short *)(this + 0x2828);
    }
    BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteFor
              (values,(bool *)(this + 0x2010),bVar10,uVar7,iVar4,*(void **)(this + 0x2820));
    uVar14 = *(ulong *)(this + 0x2810);
    if ((uVar14 & 0x1f) != 0) {
      uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
      uVar14 = (uVar14 - uVar9) + 0x20;
    }
    *(ulong *)(this + 0x2818) = *(long *)(this + 0x2818) + (bVar10 * uVar14 >> 3) + 10;
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}